

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crnlib.cpp
# Opt level: O0

char * crn_get_scale_mode_desc(crn_scale_mode sm)

{
  char *pcStack_10;
  crn_scale_mode sm_local;
  
  switch(sm) {
  case cCRNSMDisabled:
    pcStack_10 = "disabled";
    break;
  case cCRNSMAbsolute:
    pcStack_10 = "absolute";
    break;
  case cCRNSMRelative:
    pcStack_10 = "relative";
    break;
  case cCRNSMLowerPow2:
    pcStack_10 = "lowerpow2";
    break;
  case cCRNSMNearestPow2:
    pcStack_10 = "nearestpow2";
    break;
  case cCRNSMNextPow2:
    pcStack_10 = "nextpow2";
    break;
  default:
    pcStack_10 = "?";
  }
  return pcStack_10;
}

Assistant:

const char* crn_get_scale_mode_desc(crn_scale_mode sm)
{
    switch (sm)
    {
    case cCRNSMDisabled:
        return "disabled";
    case cCRNSMAbsolute:
        return "absolute";
    case cCRNSMRelative:
        return "relative";
    case cCRNSMLowerPow2:
        return "lowerpow2";
    case cCRNSMNearestPow2:
        return "nearestpow2";
    case cCRNSMNextPow2:
        return "nextpow2";
    default:
        break;
    }
    return "?";
}